

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.cpp
# Opt level: O0

ll_ringbuffer_data_pair * __thiscall RingBuffer::getReadVector(RingBuffer *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  const_pointer pbVar4;
  ulong *in_RSI;
  ll_ringbuffer_data_pair *in_RDI;
  size_t cnt2;
  size_t free_cnt;
  size_t r;
  size_t w;
  memory_order __b_1;
  memory_order __b;
  pair<ll_ringbuffer_data,_ll_ringbuffer_data> *in_stack_ffffffffffffff70;
  ulong *puVar5;
  
  std::pair<ll_ringbuffer_data,_ll_ringbuffer_data>::
  pair<ll_ringbuffer_data,_ll_ringbuffer_data,_true>(in_stack_ffffffffffffff70);
  std::operator&(memory_order_acquire,__memory_order_mask);
  uVar2 = *in_RSI;
  puVar5 = in_RSI + 1;
  std::operator&(memory_order_acquire,__memory_order_mask);
  uVar1 = in_RSI[3] & *puVar5;
  uVar2 = (in_RSI[3] & uVar2) - uVar1 & in_RSI[3];
  uVar3 = uVar1 + uVar2;
  if (in_RSI[3] + 1 < uVar3) {
    pbVar4 = al::FlexArray<al::byte,_16UL>::data((FlexArray<al::byte,_16UL> *)(in_RSI + 6));
    (in_RDI->first).buf = pbVar4 + uVar1 * in_RSI[4];
    (in_RDI->first).len = (in_RSI[3] + 1) - uVar1;
    pbVar4 = al::FlexArray<al::byte,_16UL>::data((FlexArray<al::byte,_16UL> *)(in_RSI + 6));
    (in_RDI->second).buf = pbVar4;
    (in_RDI->second).len = uVar3 & in_RSI[3];
  }
  else {
    pbVar4 = al::FlexArray<al::byte,_16UL>::data((FlexArray<al::byte,_16UL> *)(in_RSI + 6));
    (in_RDI->first).buf = pbVar4 + uVar1 * in_RSI[4];
    (in_RDI->first).len = uVar2;
    (in_RDI->second).buf = (byte *)0x0;
    (in_RDI->second).len = 0;
  }
  return in_RDI;
}

Assistant:

ll_ringbuffer_data_pair RingBuffer::getReadVector() const noexcept
{
    ll_ringbuffer_data_pair ret;

    size_t w{mWritePtr.load(std::memory_order_acquire)};
    size_t r{mReadPtr.load(std::memory_order_acquire)};
    w &= mSizeMask;
    r &= mSizeMask;
    const size_t free_cnt{(w-r) & mSizeMask};

    const size_t cnt2{r + free_cnt};
    if(cnt2 > mSizeMask+1)
    {
        /* Two part vector: the rest of the buffer after the current read ptr,
         * plus some from the start of the buffer. */
        ret.first.buf = const_cast<al::byte*>(mBuffer.data() + r*mElemSize);
        ret.first.len = mSizeMask+1 - r;
        ret.second.buf = const_cast<al::byte*>(mBuffer.data());
        ret.second.len = cnt2 & mSizeMask;
    }
    else
    {
        /* Single part vector: just the rest of the buffer */
        ret.first.buf = const_cast<al::byte*>(mBuffer.data() + r*mElemSize);
        ret.first.len = free_cnt;
        ret.second.buf = nullptr;
        ret.second.len = 0;
    }

    return ret;
}